

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

int Ppmd8_DecodeSymbol(CPpmd8 *p)

{
  byte bVar1;
  Byte BVar2;
  UInt32 UVar3;
  uint uVar4;
  UInt16 *pUVar5;
  CPpmd_State *pCVar6;
  CPpmd_See *pCVar7;
  uint uVar8;
  byte *pbVar9;
  CPpmd_State **local_988;
  CPpmd_State **pps;
  Byte symbol_3;
  int k;
  uint numMasked;
  uint num;
  uint i_1;
  CPpmd_See *see;
  UInt32 hiCnt_1;
  UInt32 count_1;
  UInt32 freqSum;
  CPpmd_State *s_1;
  CPpmd_State *ps [256];
  uint j_1;
  Byte symbol_2;
  UInt16 *prob;
  uint j;
  Byte symbol_1;
  Byte symbol;
  UInt32 hiCnt;
  UInt32 count;
  uint i;
  CPpmd_State *s;
  size_t charMask [32];
  CPpmd8 *p_local;
  
  charMask[0x1f] = (size_t)p;
  if (p->MinContext->NumStats == '\0') {
    pUVar5 = p->BinSumm[p->NS2Indx[(int)(*(byte *)((long)&p->MinContext->SummFreq + 1) - 1)]] +
             ((uint)p->NS2BSIndx[p->Base[p->MinContext->Suffix]] + p->PrevSuccess +
              (uint)p->MinContext->Flags + (p->RunLength >> 0x1a & 0x20U));
    uVar8 = p->Range >> 0xe;
    p->Range = uVar8;
    if (p->Code / uVar8 < (uint)*pUVar5) {
      RangeDec_Decode(p,0,(uint)*pUVar5);
      *pUVar5 = (*pUVar5 + 0x80) - (short)((int)(*pUVar5 + 0x20) >> 7);
      *(long *)(charMask[0x1f] + 0x10) = *(long *)charMask[0x1f] + 2;
      ps[0xff]._7_1_ = *(byte *)(*(long *)charMask[0x1f] + 2);
      Ppmd8_UpdateBin((CPpmd8 *)charMask[0x1f]);
      return (uint)ps[0xff]._7_1_;
    }
    RangeDec_Decode(p,(uint)*pUVar5,0x4000 - *pUVar5);
    *pUVar5 = *pUVar5 - (short)((int)(*pUVar5 + 0x20) >> 7);
    *(uint *)(charMask[0x1f] + 0x1c) =
         (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
               [(int)(uint)*pUVar5 >> 10];
    for (ps[0xff]._0_4_ = 0; (uint)ps[0xff] < 0x20; ps[0xff]._0_4_ = (uint)ps[0xff] + 8) {
      charMask[(ulong)(uint)ps[0xff] - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)((uint)ps[0xff] + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)*(byte *)(*(long *)charMask[0x1f] + 2) - 8)) = 0;
    *(undefined4 *)(charMask[0x1f] + 0x20) = 0;
  }
  else {
    _count = p->Base + p->MinContext->Stats;
    UVar3 = RangeDec_GetThreshold(p,(uint)p->MinContext->SummFreq);
    j = (uint)_count[1];
    if (UVar3 < j) {
      RangeDec_Decode((CPpmd8 *)charMask[0x1f],0,(uint)_count[1]);
      *(byte **)(charMask[0x1f] + 0x10) = _count;
      bVar1 = *_count;
      Ppmd8_Update1_0((CPpmd8 *)charMask[0x1f]);
      return (uint)bVar1;
    }
    *(undefined4 *)(charMask[0x1f] + 0x20) = 0;
    hiCnt = (UInt32)**(byte **)charMask[0x1f];
    do {
      pbVar9 = _count + 6;
      j = _count[7] + j;
      if (UVar3 < j) {
        RangeDec_Decode((CPpmd8 *)charMask[0x1f],j - _count[7],(uint)_count[7]);
        *(byte **)(charMask[0x1f] + 0x10) = pbVar9;
        bVar1 = *pbVar9;
        Ppmd8_Update1((CPpmd8 *)charMask[0x1f]);
        return (uint)bVar1;
      }
      hiCnt = hiCnt - 1;
      _count = pbVar9;
    } while (hiCnt != 0);
    if (*(ushort *)(*(long *)charMask[0x1f] + 2) <= UVar3) {
      return -2;
    }
    RangeDec_Decode((CPpmd8 *)charMask[0x1f],j,*(ushort *)(*(long *)charMask[0x1f] + 2) - j);
    for (prob._4_4_ = 0; prob._4_4_ < 0x20; prob._4_4_ = prob._4_4_ + 8) {
      charMask[(ulong)prob._4_4_ - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 1) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 2) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 3) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 4) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 5) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 6) - 1] = 0xffffffffffffffff;
      charMask[(ulong)(prob._4_4_ + 7) - 1] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + ((ulong)*pbVar9 - 8)) = 0;
    hiCnt = (UInt32)**(byte **)charMask[0x1f];
    do {
      *(undefined1 *)((long)charMask + ((ulong)_count[-6] - 8)) = 0;
      hiCnt = hiCnt - 1;
      _count = _count + -6;
    } while (hiCnt != 0);
  }
  while( true ) {
    uVar8 = (uint)**(byte **)charMask[0x1f];
    do {
      *(int *)(charMask[0x1f] + 0x18) = *(int *)(charMask[0x1f] + 0x18) + 1;
      if (*(int *)(*(long *)charMask[0x1f] + 8) == 0) {
        return -1;
      }
      *(ulong *)charMask[0x1f] =
           *(long *)(charMask[0x1f] + 0x38) + (ulong)*(uint *)(*(long *)charMask[0x1f] + 8);
    } while (**(byte **)charMask[0x1f] == uVar8);
    see._4_4_ = 0;
    numMasked = 0;
    bVar1 = **(byte **)charMask[0x1f];
    _count_1 = (CPpmd_State *)
               (*(long *)(charMask[0x1f] + 0x38) + (ulong)*(uint *)(*(long *)charMask[0x1f] + 4));
    do {
      uVar4 = (uint)*(char *)((long)charMask + ((ulong)_count_1->Symbol - 8));
      see._4_4_ = (_count_1->Freq & uVar4) + see._4_4_;
      pCVar6 = _count_1 + 1;
      ps[(ulong)numMasked - 1] = _count_1;
      numMasked = numMasked - uVar4;
      _count_1 = pCVar6;
    } while (numMasked != bVar1 - uVar8);
    pCVar7 = Ppmd8_MakeEscFreq((CPpmd8 *)charMask[0x1f],uVar8,&hiCnt_1);
    hiCnt_1 = see._4_4_ + hiCnt_1;
    UVar3 = RangeDec_GetThreshold((CPpmd8 *)charMask[0x1f],hiCnt_1);
    if (UVar3 < see._4_4_) break;
    if (hiCnt_1 <= UVar3) {
      return -2;
    }
    RangeDec_Decode((CPpmd8 *)charMask[0x1f],see._4_4_,hiCnt_1 - see._4_4_);
    pCVar7->Summ = pCVar7->Summ + (short)hiCnt_1;
    do {
      numMasked = numMasked - 1;
      *(undefined1 *)((long)charMask + ((ulong)ps[(ulong)numMasked - 1]->Symbol - 8)) = 0;
    } while (numMasked != 0);
  }
  local_988 = &s_1;
  see._4_4_ = 0;
  while (see._4_4_ = (*local_988)->Freq + see._4_4_, see._4_4_ <= UVar3) {
    local_988 = local_988 + 1;
  }
  _count_1 = *local_988;
  RangeDec_Decode((CPpmd8 *)charMask[0x1f],see._4_4_ - _count_1->Freq,(uint)_count_1->Freq);
  if ((pCVar7->Shift < 7) && (BVar2 = pCVar7->Count + 0xff, pCVar7->Count = BVar2, BVar2 == '\0')) {
    pCVar7->Summ = pCVar7->Summ << 1;
    bVar1 = pCVar7->Shift;
    pCVar7->Shift = bVar1 + 1;
    pCVar7->Count = (Byte)(3 << (bVar1 & 0x1f));
  }
  *(CPpmd_State **)(charMask[0x1f] + 0x10) = _count_1;
  bVar1 = _count_1->Symbol;
  Ppmd8_Update2((CPpmd8 *)charMask[0x1f]);
  return (uint)bVar1;
}

Assistant:

int Ppmd8_DecodeSymbol(CPpmd8 *p)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 0)
  {
    CPpmd_State *s = Ppmd8_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = RangeDec_GetThreshold(p, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd8_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    RangeDec_Decode(p, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd8_GetBinSumm(p);
    if (((p->Code / (p->Range >>= 14)) < *prob))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd8Context_OneState(p->MinContext))->Symbol;
      Ppmd8_UpdateBin(p);
      return symbol;
    }
    RangeDec_Decode(p, *prob, (1 << 14) - *prob);
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD8_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd8Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd8_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd8_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd8_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = RangeDec_GetThreshold(p, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    RangeDec_Decode(p, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}